

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spfgmr_serial.c
# Opt level: O3

int PSolve(void *Data,N_Vector r_vec,N_Vector z_vec,realtype tol,int lr)

{
  long lVar1;
  realtype *prVar2;
  realtype *prVar3;
  realtype *prVar4;
  int iVar5;
  long lVar6;
  
  prVar2 = N_VGetArrayPointer(r_vec);
  if (((prVar2 == (realtype *)0x0) ||
      (prVar3 = N_VGetArrayPointer(z_vec), prVar3 == (realtype *)0x0)) ||
     (prVar4 = N_VGetArrayPointer(*(N_Vector *)((long)Data + 8)), prVar4 == (realtype *)0x0)) {
    PSolve_cold_1();
    iVar5 = 1;
  }
  else {
    lVar1 = *Data;
    iVar5 = 0;
    if (0 < lVar1) {
      lVar6 = 0;
      do {
        prVar3[lVar6] = prVar2[lVar6] / prVar4[lVar6];
        lVar6 = lVar6 + 1;
        iVar5 = 0;
      } while (lVar1 != lVar6);
    }
  }
  return iVar5;
}

Assistant:

int PSolve(void* Data, N_Vector r_vec, N_Vector z_vec, realtype tol, int lr)
{
  /* local variables */
  realtype *r, *z, *d;
  sunindextype i;
  UserData *ProbData;
  
  /* access user data structure and vector data */
  ProbData = (UserData *) Data;
  r = N_VGetArrayPointer(r_vec);
  if (check_flag(r, "N_VGetArrayPointer", 0)) return 1;
  z = N_VGetArrayPointer(z_vec);
  if (check_flag(z, "N_VGetArrayPointer", 0)) return 1;
  d = N_VGetArrayPointer(ProbData->d);
  if (check_flag(d, "N_VGetArrayPointer", 0)) return 1;
  
  /* iterate through domain, performing Jacobi solve */
  for (i=0; i<ProbData->N; i++) 
    z[i] = r[i] / d[i];

  /* return with success */
  return 0;
}